

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexPointFilter::release(PtexPointFilter *this)

{
  (*(this->super_PtexFilter)._vptr_PtexFilter[1])();
  return;
}

Assistant:

virtual void eval(float* result, int firstchan, int nchannels,
                      int faceid, float u, float v,
                      float /*uw1*/, float /*vw1*/, float /*uw2*/, float /*vw2*/,
                      float /*width*/, float /*blur*/)
    {
        if (!_tx || nchannels <= 0) return;
        if (faceid < 0 || faceid >= _tx->numFaces()) return;
        const FaceInfo& f = _tx->getFaceInfo(faceid);
        int resu = f.res.u(), resv = f.res.v();
        int ui = PtexUtils::clamp(int(u*(float)resu), 0, resu-1);
        int vi = PtexUtils::clamp(int(v*(float)resv), 0, resv-1);
        _tx->getPixel(faceid, ui, vi, result, firstchan, nchannels);
    }